

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.hpp
# Opt level: O2

void __thiscall ClipperLib::PolyTree::~PolyTree(PolyTree *this)

{
  (this->super_PolyNode)._vptr_PolyNode = (_func_int **)&PTR__PolyTree_00127d70;
  Clear(this);
  std::_Vector_base<ClipperLib::PolyNode_*,_std::allocator<ClipperLib::PolyNode_*>_>::~_Vector_base
            (&(this->AllNodes).
              super__Vector_base<ClipperLib::PolyNode_*,_std::allocator<ClipperLib::PolyNode_*>_>);
  PolyNode::~PolyNode(&this->super_PolyNode);
  return;
}

Assistant:

~PolyTree(){ Clear(); }